

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

void amrex::MultiFab::LinComb
               (MultiFab *dst,Real a,MultiFab *x,int xcomp,Real b,MultiFab *y,int ycomp,int dstcomp,
               int numcomp,IntVect *nghost)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  Box local_1e0;
  int local_1c4;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  FabArray<amrex::FArrayBox> *local_190;
  Real local_188;
  FabArray<amrex::FArrayBox> *local_180;
  Real local_178;
  FabArray<amrex::FArrayBox> *local_170;
  ulong local_168;
  long local_160;
  ulong local_158;
  Array4<double> dfab;
  Array4<const_double> yfab;
  Array4<const_double> xfab;
  MFIter mfi;
  
  local_190 = &dst->super_FabArray<amrex::FArrayBox>;
  local_188 = a;
  local_180 = &x->super_FabArray<amrex::FArrayBox>;
  local_178 = b;
  local_170 = &y->super_FabArray<amrex::FArrayBox>;
  MFIter::MFIter(&mfi,(FabArrayBase *)dst,true);
  if (numcomp < 1) {
    numcomp = 0;
  }
  local_168 = (ulong)(uint)numcomp;
  local_1a0 = (long)ycomp << 3;
  local_1a8 = (long)xcomp << 3;
  local_198 = (long)dstcomp << 3;
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    MFIter::growntilebox(&local_1e0,&mfi,nghost);
    if ((((local_1e0.smallend.vect[0] <= local_1e0.bigend.vect[0]) &&
         (local_1e0.smallend.vect[1] <= local_1e0.bigend.vect[1])) &&
        (local_1e0.smallend.vect[2] <= local_1e0.bigend.vect[2])) && (local_1e0.btype.itype < 8)) {
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&xfab,local_180,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&yfab,local_170,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&dfab,local_190,&mfi);
      lVar8 = (long)local_1e0.smallend.vect[1];
      local_160 = (long)local_1e0.smallend.vect[2];
      local_1c4 = local_1e0.bigend.vect[2];
      lVar5 = (long)local_1e0.smallend.vect[0] * 8;
      local_1b0 = local_198;
      local_1b8 = local_1a8;
      local_1c0 = local_1a0;
      for (local_158 = 0; lVar2 = local_160, local_158 != local_168; local_158 = local_158 + 1) {
        for (; (int)lVar2 <= local_1e0.bigend.vect[2]; lVar2 = lVar2 + 1) {
          lVar4 = (long)yfab.p +
                  yfab.nstride * local_1c0 +
                  (lVar2 - yfab.begin.z) * yfab.kstride * 8 +
                  (lVar8 - yfab.begin.y) * yfab.jstride * 8 + (long)yfab.begin.x * -8 + lVar5;
          lVar7 = (long)xfab.p +
                  xfab.nstride * local_1b8 +
                  (lVar8 - xfab.begin.y) * xfab.jstride * 8 +
                  (lVar2 - xfab.begin.z) * xfab.kstride * 8 + (long)xfab.begin.x * -8 + lVar5;
          lVar6 = (long)dfab.p +
                  dfab.nstride * local_1b0 +
                  (lVar8 - dfab.begin.y) * dfab.jstride * 8 +
                  (lVar2 - dfab.begin.z) * dfab.kstride * 8 + (long)dfab.begin.x * -8 + lVar5;
          for (lVar1 = lVar8; lVar1 <= local_1e0.bigend.vect[1]; lVar1 = lVar1 + 1) {
            if (local_1e0.smallend.vect[0] <= local_1e0.bigend.vect[0]) {
              lVar3 = 0;
              do {
                *(double *)(lVar6 + lVar3 * 8) =
                     *(double *)(lVar7 + lVar3 * 8) * local_188 +
                     *(double *)(lVar4 + lVar3 * 8) * local_178;
                lVar3 = lVar3 + 1;
              } while ((local_1e0.bigend.vect[0] - local_1e0.smallend.vect[0]) + 1 != (int)lVar3);
            }
            lVar4 = lVar4 + yfab.jstride * 8;
            lVar7 = lVar7 + xfab.jstride * 8;
            lVar6 = lVar6 + dfab.jstride * 8;
          }
        }
        local_1c0 = local_1c0 + 8;
        local_1b8 = local_1b8 + 8;
        local_1b0 = local_1b0 + 8;
      }
    }
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
MultiFab::LinComb (MultiFab& dst,
                   Real a, const MultiFab& x, int xcomp,
                   Real b, const MultiFab& y, int ycomp,
                   int dstcomp, int numcomp, const IntVect& nghost)
{
    BL_ASSERT(dst.boxArray() == x.boxArray());
    BL_ASSERT(dst.distributionMap == x.distributionMap);
    BL_ASSERT(dst.boxArray() == y.boxArray());
    BL_ASSERT(dst.distributionMap == y.distributionMap);
    BL_ASSERT(dst.nGrowVect().allGE(nghost) && x.nGrowVect().allGE(nghost) && y.nGrowVect().allGE(nghost));

    BL_PROFILE("MultiFab::LinComb()");

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && dst.isFusingCandidate()) {
        auto const& dstma = dst.arrays();
        auto const& xma = x.const_arrays();
        auto const& yma = y.const_arrays();
        ParallelFor(dst, nghost, numcomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            dstma[box_no](i,j,k,dstcomp+n) = a*xma[box_no](i,j,k,xcomp+n)
                +                            b*yma[box_no](i,j,k,ycomp+n);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(dst,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(nghost);

            if (bx.ok()) {
                auto const xfab =   x.array(mfi);
                auto const yfab =   y.array(mfi);
                auto       dfab = dst.array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D( bx, numcomp, i, j, k, n,
                {
                    dfab(i,j,k,dstcomp+n) = a*xfab(i,j,k,xcomp+n) + b*yfab(i,j,k,ycomp+n);
                });
            }
        }
    }
}